

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_next.c
# Opt level: O2

int next_updateheader(t_soundfile *sf,size_t nframes)

{
  int doit;
  uint32_t uVar1;
  ssize_t sVar2;
  ulong uVar3;
  ulong local_18;
  
  doit = soundfile_needsbyteswap(sf);
  uVar3 = (long)sf->sf_bytesperframe * nframes;
  if (0xfffffffe < uVar3) {
    uVar3 = 0xffffffff;
  }
  uVar1 = swap4((uint32_t)uVar3,doit);
  local_18 = (ulong)uVar1;
  sVar2 = fd_write(sf->sf_fd,8,&local_18,4);
  return (int)(3 < sVar2);
}

Assistant:

static int next_updateheader(t_soundfile *sf, size_t nframes)
{
    int swap = soundfile_needsbyteswap(sf);
    size_t datasize = nframes * sf->sf_bytesperframe;

    if (datasize > NEXTMAXBYTES)
        datasize = NEXT_UNKNOWN_SIZE;
    datasize = swap4(datasize, swap);
    if (fd_write(sf->sf_fd, 8, &datasize, 4) < 4)
        return 0;

#ifdef DEBUG_SOUNDFILE
    datasize = swap4(datasize, swap);
    post("next %.4s (%s)", (sf->sf_bigendian ? ".snd" : "dns."),
        (sf->sf_bigendian ? "big" : "little"));
    if (datasize == NEXT_UNKNOWN_SIZE)
        post("  data length -1");
    else
        post("  data length %d", datasize);
#endif

    return 1;
}